

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lapi.cpp
# Opt level: O1

void lua_settop(lua_State *L,int idx)

{
  StkId pTVar1;
  StkId pTVar2;
  
  if (-1 < idx) {
    pTVar1 = L->top;
    pTVar2 = L->ci->func + (ulong)(uint)idx + 1;
    if (pTVar1 < pTVar2) {
      do {
        pTVar1->tt_ = 0;
        pTVar1 = pTVar1 + 1;
      } while (pTVar1 < pTVar2);
      L->top = pTVar1;
    }
    L->top = pTVar2;
    return;
  }
  L->top = L->top + (long)idx + 1;
  return;
}

Assistant:

LUA_API void lua_settop (lua_State *L, int idx) {
  StkId func = L->ci->func;
  lua_lock(L);
  if (idx >= 0) {
    api_check(L, idx <= L->stack_last - (func + 1), "new top too large");
    while (L->top < (func + 1) + idx)
      setnilvalue(L->top++);
    L->top = (func + 1) + idx;
  }
  else {
    api_check(L, -(idx+1) <= (L->top - (func + 1)), "invalid new top");
    L->top += idx+1;  /* `subtract' index (index is negative) */
  }
  lua_unlock(L);
}